

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_vacuum.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalVacuum::Deserialize(LogicalVacuum *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::VacuumInfo_*,_false> _Var1;
  TableCatalogEntry *pTVar2;
  _Head_base<0UL,_duckdb::LogicalVacuum_*,_false> _Var3;
  undefined8 uVar4;
  LogicalVacuum *this_00;
  pointer pLVar5;
  type pVVar6;
  ClientContext *context;
  Binder *ref;
  pointer pBVar7;
  pointer pBVar8;
  InvalidInputException *this_01;
  _Head_base<0UL,_duckdb::LogicalVacuum_*,_false> local_70;
  allocator local_61;
  undefined1 local_60 [16];
  shared_ptr<duckdb::Binder,_true> binder;
  string local_40;
  
  this_00 = (LogicalVacuum *)operator_new(0xb0);
  LogicalVacuum(this_00);
  local_70._M_head_impl = this_00;
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
            ((Deserializer *)(local_60 + 8),(field_id_t)deserializer,(char *)0xc8);
  pLVar5 = unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
           operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                       *)&local_70);
  Deserializer::
  ReadProperty<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            (deserializer,0xc9,"column_id_map",&pLVar5->column_id_map);
  uVar4 = local_60._8_8_;
  local_60._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pLVar5 = unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
           operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                       *)&local_70);
  _Var1._M_head_impl =
       (pLVar5->info).super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>
       ._M_t.super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
       super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl;
  (pLVar5->info).super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t
  .super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
  super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl = (VacuumInfo *)uVar4;
  if (_Var1._M_head_impl != (VacuumInfo *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ParseInfo + 8))();
  }
  pLVar5 = unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
           operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                       *)&local_70);
  pVVar6 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator*
                     (&pLVar5->info);
  if (pVVar6->has_table == true) {
    context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
    Binder::CreateBinder
              ((Binder *)&binder,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
    ref = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
              (&pVVar6->ref);
    Binder::Bind((Binder *)local_60,(TableRef *)ref);
    pBVar7 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                         *)local_60);
    local_40._M_dataplus._M_p = (pointer)local_60._0_8_;
    if (pBVar7->type != BASE_TABLE) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"can only vacuum or analyze base tables",&local_61);
      InvalidInputException::InvalidInputException(this_01,&local_40);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_60._0_8_ =
         (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
          )0x0;
    pBVar8 = unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
             ::operator->((unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
                           *)&local_40);
    pTVar2 = pBVar8->table;
    pLVar5 = unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
             operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                         *)&local_70);
    (pLVar5->table).ptr = pTVar2;
    if ((BoundTableRef *)local_40._M_dataplus._M_p != (BoundTableRef *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
        local_60._0_8_ != (BoundTableRef *)0x0) {
      (**(code **)(*(long *)local_60._0_8_ + 8))();
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  _Var3._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (LogicalVacuum *)0x0;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)_Var3._M_head_impl;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_60._8_8_)[1])();
    if (local_70._M_head_impl != (LogicalVacuum *)0x0) {
      (*((local_70._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalVacuum::Deserialize(Deserializer &deserializer) {
	auto result = unique_ptr<LogicalVacuum>(new LogicalVacuum());

	auto tmp_info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "info");
	deserializer.ReadProperty(201, "column_id_map", result->column_id_map);

	result->info = unique_ptr_cast<ParseInfo, VacuumInfo>(std::move(tmp_info));
	auto &info = *result->info;
	if (info.has_table) {
		// deserialize the 'table'
		auto &context = deserializer.Get<ClientContext &>();
		auto binder = Binder::CreateBinder(context);
		auto bound_table = binder->Bind(*info.ref);
		if (bound_table->type != TableReferenceType::BASE_TABLE) {
			throw InvalidInputException("can only vacuum or analyze base tables");
		}
		auto ref = unique_ptr_cast<BoundTableRef, BoundBaseTableRef>(std::move(bound_table));
		auto &table = ref->table;
		result->SetTable(table);
		// FIXME: we should probably verify that the 'column_id_map' and 'columns' are the same on the bound table after
		// deserialization?
	}
	return std::move(result);
}